

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O0

int WebRtcVad_CalcVad8khz(VadInstT *inst,int16_t *speech_frame,size_t frame_length)

{
  int16_t iVar1;
  int16_t local_2c [3];
  int16_t total_power;
  int16_t feature_vector [6];
  size_t frame_length_local;
  int16_t *speech_frame_local;
  VadInstT *inst_local;
  
  feature_vector._4_8_ = frame_length;
  iVar1 = WebRtcVad_CalculateFeatures(inst,speech_frame,frame_length,local_2c);
  iVar1 = GmmProbability(inst,local_2c,iVar1,feature_vector._4_8_);
  inst->vad = (int)iVar1;
  return inst->vad;
}

Assistant:

int WebRtcVad_CalcVad8khz(VadInstT* inst, const int16_t* speech_frame,
                          size_t frame_length)
{
    int16_t feature_vector[kNumChannels], total_power;

    // Get power in the bands
    total_power = WebRtcVad_CalculateFeatures(inst, speech_frame, frame_length,
                                              feature_vector);

    // Make a VAD
    inst->vad = GmmProbability(inst, feature_vector, total_power, frame_length);

    return inst->vad;
}